

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  bool bVar1;
  uint uVar2;
  long *__s;
  uchar *puVar3;
  search_accelerator *pObject;
  uint in_ESI;
  search_accelerator *in_RDI;
  void *in_stack_00000010;
  uint t;
  uint c2;
  int i;
  int limit;
  uint c1;
  uint c0;
  uint num_unique_digrams;
  uint8 *pDict;
  uint next_thread_index;
  void *in_stack_00000590;
  uint64 in_stack_00000598;
  search_accelerator *in_stack_000005a0;
  undefined1 in_stack_ffffffffffffff93;
  uint in_stack_ffffffffffffff94;
  uchar uVar4;
  vector<lzham::dict_match> *in_stack_ffffffffffffff98;
  uint32 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint uVar5;
  uint local_28;
  bool local_1;
  
  bVar1 = vector<lzham::dict_match>::try_resize_no_construct
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     (bool)in_stack_ffffffffffffff93);
  if (bVar1) {
    bVar1 = vector<long>::try_resize_no_construct
                      ((vector<long> *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                       (bool)in_stack_ffffffffffffff93);
    if (bVar1) {
      __s = vector<long>::get_ptr(&in_RDI->m_match_refs);
      uVar2 = vector<long>::size_in_bytes(&in_RDI->m_match_refs);
      memset(__s,0xff,(ulong)uVar2);
      in_RDI->m_fill_lookahead_pos = in_RDI->m_lookahead_pos;
      in_RDI->m_fill_lookahead_size = in_ESI;
      in_RDI->m_fill_dict_size = in_RDI->m_cur_dict_size;
      in_RDI->m_next_match_ref = 0;
      if (in_RDI->m_pTask_pool == (task_pool *)0x0) {
        find_all_matches_callback(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
        in_RDI->m_num_completed_helper_threads = 0;
      }
      else {
        bVar1 = vector<unsigned_char>::try_resize_no_construct
                          ((vector<unsigned_char> *)in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,(bool)in_stack_ffffffffffffff93);
        if (!bVar1) {
          return false;
        }
        puVar3 = vector<unsigned_char>::get_ptr(&in_RDI->m_hash_thread_index);
        uVar2 = vector<unsigned_char>::size_in_bytes(&in_RDI->m_hash_thread_index);
        memset(puVar3,0xff,(ulong)uVar2);
        uVar2 = 0;
        pObject = (search_accelerator *)
                  vector<unsigned_char>::operator[]
                            (&in_RDI->m_dict,in_RDI->m_lookahead_pos & in_RDI->m_max_dict_size_mask)
        ;
        if (2 < in_ESI) {
          local_28 = (uint)*(byte *)&pObject->m_pLZBase;
          in_stack_ffffffffffffffd0 = in_ESI - 2;
          uVar5 = (uint)*(byte *)((long)&pObject->m_pLZBase + 1);
          for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffd4 = uVar5,
              in_stack_ffffffffffffffcc < in_stack_ffffffffffffffd0;
              in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
            in_stack_ffffffffffffffc8 = (uint)*(byte *)((long)&pObject->m_pLZBase + 2);
            in_stack_ffffffffffffffc4 =
                 hash3_to_16(local_28,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
            pObject = (search_accelerator *)((long)&pObject->m_pLZBase + 1);
            uVar5 = in_stack_ffffffffffffffc8;
            puVar3 = vector<unsigned_char>::operator[]
                               (&in_RDI->m_hash_thread_index,in_stack_ffffffffffffffc4);
            if (*puVar3 == 0xff) {
              uVar4 = (uchar)uVar2;
              puVar3 = vector<unsigned_char>::operator[]
                                 (&in_RDI->m_hash_thread_index,in_stack_ffffffffffffffc4);
              *puVar3 = uVar4;
              uVar2 = uVar2 + 1;
              if (uVar2 == in_RDI->m_max_helper_threads) {
                uVar2 = 0;
              }
            }
            local_28 = in_stack_ffffffffffffffd4;
          }
        }
        in_RDI->m_num_completed_helper_threads = 0;
        bVar1 = task_pool::
                queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                          ((task_pool *)CONCAT44(in_ESI,uVar2),pObject,
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc4,in_stack_00000010);
        if (!bVar1) {
          return false;
        }
      }
      local_1 = find_len2_matches(in_RDI);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
         return false;

      if (!m_match_refs.try_resize_no_construct(num_bytes))
         return false;

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if (!m_pTask_pool)
      {
         find_all_matches_callback(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         if (!m_hash_thread_index.try_resize_no_construct(0x10000))
            return false;

         memset(m_hash_thread_index.get_ptr(), 0xFF, m_hash_thread_index.size_in_bytes());

         uint next_thread_index = 0;
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
         uint num_unique_digrams = 0;

         if (num_bytes >= 3)
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];

            const int limit = ((int)num_bytes - 2);
            for (int i = 0; i < limit; i++)
            {
               uint c2 = pDict[2];
               uint t = hash3_to_16(c0, c1, c2);
               c0 = c1;
               c1 = c2;

               pDict++;

               if (m_hash_thread_index[t] == UINT8_MAX)
               {
                  num_unique_digrams++;

                  m_hash_thread_index[t] = static_cast<uint8>(next_thread_index);
                  if (++next_thread_index == m_max_helper_threads)
                        next_thread_index = 0;
               }
            }
         }
         
         m_num_completed_helper_threads = 0;

         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback, 0, m_max_helper_threads))
            return false;
      }

      return find_len2_matches();
   }